

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeitems.cpp
# Opt level: O3

void ADegninOre::InPlaceConstructor(void *mem)

{
  AActor::AActor((AActor *)mem);
  *(undefined ***)mem = &PTR_StaticType_0087ca30;
  return;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveForceField)
{
	PARAM_ACTION_PROLOGUE;

	self->flags &= ~MF_SPECIAL;

	for (int i = 0; i < self->Sector->linecount; ++i)
	{
		line_t *line = self->Sector->lines[i];
		if (line->backsector != NULL && line->special == ForceField)
		{
			line->flags &= ~(ML_BLOCKING|ML_BLOCKEVERYTHING);
			line->special = 0;
			line->sidedef[0]->SetTexture(side_t::mid, FNullTextureID());
			line->sidedef[1]->SetTexture(side_t::mid, FNullTextureID());
		}
	}
	return 0;
}